

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 6522Implementation.hpp
# Opt level: O2

void __thiscall
MOS::MOS6522::
MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
::run_for(MOS6522<Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)3>::VIAPortHandler>
          *this,HalfCycles half_cycles)

{
  IntType number_of_half_cycles;
  
  if (half_cycles.super_WrappedInt<HalfCycles>.length_ != 0) {
    if ((this->super_MOS6522Storage).is_phase2_ == true) {
      do_phase2(this);
      half_cycles.super_WrappedInt<HalfCycles>.length_ =
           (WrappedInt<HalfCycles>)((long)half_cycles.super_WrappedInt<HalfCycles>.length_ + -1);
    }
    for (; 1 < (long)half_cycles.super_WrappedInt<HalfCycles>.length_;
        half_cycles.super_WrappedInt<HalfCycles>.length_ =
             (WrappedInt<HalfCycles>)((long)half_cycles.super_WrappedInt<HalfCycles>.length_ + -2))
    {
      do_phase1(this);
      do_phase2(this);
    }
    if (half_cycles.super_WrappedInt<HalfCycles>.length_ != 0) {
      do_phase1(this);
    }
    (this->super_MOS6522Storage).is_phase2_ = half_cycles.super_WrappedInt<HalfCycles>.length_ != 0;
  }
  return;
}

Assistant:

void MOS6522<T>::run_for(const HalfCycles half_cycles) {
	auto number_of_half_cycles = half_cycles.as_integral();
	if(!number_of_half_cycles) return;

	if(is_phase2_) {
		do_phase2();
		number_of_half_cycles--;
	}

	while(number_of_half_cycles >= 2) {
		do_phase1();
		do_phase2();
		number_of_half_cycles -= 2;
	}

	if(number_of_half_cycles) {
		do_phase1();
		is_phase2_ = true;
	} else {
		is_phase2_ = false;
	}
}